

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-currentexe.c
# Opt level: O0

int run_test_get_currentexe(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcStack_420;
  int r;
  char *path;
  char *match;
  size_t size;
  char buffer [1024];
  
  match = (char *)0x400;
  iVar1 = uv_exepath((char *)&size,(size_t *)&match);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-currentexe.c"
            ,0x26,"!r");
    abort();
  }
  if ((executable_path[0] == '.') && (executable_path[1] == '/')) {
    pcStack_420 = executable_path + 2;
  }
  else {
    pcStack_420 = executable_path;
  }
  pcVar2 = strstr((char *)&size,pcStack_420);
  if (pcVar2 != (char *)0x0) {
    iVar1 = strcmp(pcVar2,pcStack_420);
    pcVar2 = match;
    if (iVar1 == 0) {
      pcVar3 = (char *)strlen((char *)&size);
      if (pcVar2 != pcVar3) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-currentexe.c"
                ,0x36,"size == strlen(buffer)");
        abort();
      }
      match = (char *)0x400;
      iVar1 = uv_exepath((char *)0x0,(size_t *)&match);
      if (iVar1 != -0x16) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-currentexe.c"
                ,0x3b,"r == UV_EINVAL");
        abort();
      }
      iVar1 = uv_exepath((char *)&size,(size_t *)0x0);
      if (iVar1 != -0x16) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-currentexe.c"
                ,0x3e,"r == UV_EINVAL");
        abort();
      }
      match = (char *)0x0;
      iVar1 = uv_exepath((char *)&size,(size_t *)&match);
      if (iVar1 != -0x16) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-currentexe.c"
                ,0x42,"r == UV_EINVAL");
        abort();
      }
      memset(&size,0xff,0x400);
      match = (char *)0x1;
      iVar1 = uv_exepath((char *)&size,(size_t *)&match);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-currentexe.c"
                ,0x48,"r == 0");
        abort();
      }
      if (match != (char *)0x0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-currentexe.c"
                ,0x49,"size == 0");
        abort();
      }
      if ((char)size != '\0') {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-currentexe.c"
                ,0x4a,"buffer[0] == \'\\0\'");
        abort();
      }
      memset(&size,0xff,0x400);
      match = (char *)0x2;
      iVar1 = uv_exepath((char *)&size,(size_t *)&match);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-currentexe.c"
                ,0x50,"r == 0");
        abort();
      }
      if (match != (char *)0x1) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-currentexe.c"
                ,0x51,"size == 1");
        abort();
      }
      if ((char)size == '\0') {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-currentexe.c"
                ,0x52,"buffer[0] != \'\\0\'");
        abort();
      }
      if (size._1_1_ != '\0') {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-currentexe.c"
                ,0x53,"buffer[1] == \'\\0\'");
        abort();
      }
      return 0;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-currentexe.c"
          ,0x35,"match && !strcmp(match, path)");
  abort();
}

Assistant:

TEST_IMPL(get_currentexe) {
  char buffer[PATHMAX];
  size_t size;
  char* match;
  char* path;
  int r;

  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(buffer, &size);
  ASSERT(!r);

  /* uv_exepath can return an absolute path on darwin, so if the test runner
   * was run with a relative prefix of "./", we need to strip that prefix off
   * executable_path or we'll fail. */
  if (executable_path[0] == '.' && executable_path[1] == '/') {
    path = executable_path + 2;
  } else {
    path = executable_path;
  }

  match = strstr(buffer, path);
  /* Verify that the path returned from uv_exepath is a subdirectory of
   * executable_path.
   */
  ASSERT(match && !strcmp(match, path));
  ASSERT(size == strlen(buffer));

  /* Negative tests */
  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(NULL, &size);
  ASSERT(r == UV_EINVAL);

  r = uv_exepath(buffer, NULL);
  ASSERT(r == UV_EINVAL);

  size = 0;
  r = uv_exepath(buffer, &size);
  ASSERT(r == UV_EINVAL);

  memset(buffer, -1, sizeof(buffer));

  size = 1;
  r = uv_exepath(buffer, &size);
  ASSERT(r == 0);
  ASSERT(size == 0);
  ASSERT(buffer[0] == '\0');

  memset(buffer, -1, sizeof(buffer));

  size = 2;
  r = uv_exepath(buffer, &size);
  ASSERT(r == 0);
  ASSERT(size == 1);
  ASSERT(buffer[0] != '\0');
  ASSERT(buffer[1] == '\0');

  return 0;
}